

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSAify.cpp
# Opt level: O0

void __thiscall wasm::SSAify::~SSAify(SSAify *this)

{
  SSAify *this_local;
  
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__SSAify_0271ba68;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
            (&this->functionPrepends);
  Pass::~Pass(&this->super_Pass);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }